

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator::GenerateFieldInfo
          (ImmutableMapFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  string_view terminating_string;
  bool bVar1;
  uint32_t number;
  JavaType JVar2;
  FieldDescriptor *pFVar3;
  MessageLite *pMVar4;
  EnumDescriptor *pEVar5;
  string_view text;
  string_view var_name;
  
  WriteUInt32ToUtf16CharSequence(this->descriptor_->number_,output);
  number = GetExperimentalJavaFieldType(this->descriptor_);
  WriteUInt32ToUtf16CharSequence(number,output);
  text._M_str = "\"$name$_\",\n$default_entry$,\n";
  text._M_len = 0x1c;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text);
  pFVar3 = MapValueField(this->descriptor_);
  pMVar4 = protobuf::internal::ExtensionSet::GetMessage
                     (&(pFVar3->merged_features_->field_0)._impl_._extensions_,pb::java,
                      (MessageLite *)PTR__JavaFeatures_default_instance__00832a20);
  if ((*(char *)((long)&pMVar4[1]._internal_metadata_.ptr_ + 4) == '\0') &&
     (pEVar5 = FieldDescriptor::enum_type(pFVar3), pEVar5 != (EnumDescriptor *)0x0)) {
    pEVar5 = FieldDescriptor::enum_type(pFVar3);
    bVar1 = EnumDescriptor::is_closed(pEVar5);
    if (!bVar1) {
      return;
    }
  }
  JVar2 = GetJavaType(pFVar3);
  if (JVar2 == JAVATYPE_ENUM) {
    pFVar3 = MapValueField(this->descriptor_);
    terminating_string._M_str = ",\n";
    terminating_string._M_len = 2;
    var_name._M_str = "$value_enum_type$";
    var_name._M_len = 0x11;
    PrintEnumVerifierLogic
              (printer,pFVar3,&this->variables_,var_name,terminating_string,
               (this->context_->options_).enforce_lite);
  }
  return;
}

Assistant:

void ImmutableMapFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  printer->Print(variables_,
                 "\"$name$_\",\n"
                 "$default_entry$,\n");
  const FieldDescriptor* value = MapValueField(descriptor_);
  if (!SupportUnknownEnumValue(value) && GetJavaType(value) == JAVATYPE_ENUM) {
    PrintEnumVerifierLogic(printer, MapValueField(descriptor_), variables_,
                           /*var_name=*/"$value_enum_type$",
                           /*terminating_string=*/",\n",
                           /*enforce_lite=*/context_->EnforceLite());
  }
}